

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb__wildmatch_raw2(char *expr,char *candidate,int search,int insensitive)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  __int32_t **pp_Var5;
  long lVar6;
  char cVar7;
  char *pcVar8;
  char cVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  char *qstring;
  char *pcVar14;
  char *local_60;
  
  cVar7 = *expr;
  if (search == 0) {
    iVar12 = -(uint)(cVar7 == '*');
    lVar11 = 0;
    do {
      if (cVar7 == '?') {
        if (candidate[lVar11] == '\0') {
          return -1;
        }
      }
      else {
        if (cVar7 == '*') {
          candidate = candidate + lVar11;
          expr = expr + lVar11;
          goto LAB_00154102;
        }
        if (cVar7 == '\0') {
          return -(uint)(candidate[lVar11] != '\0');
        }
        if (insensitive == 0) {
          if (candidate[lVar11] != cVar7) {
            return -1;
          }
        }
        else {
          pp_Var5 = __ctype_tolower_loc();
          if ((*pp_Var5)[candidate[lVar11]] != (*pp_Var5)[cVar7]) {
            return -1;
          }
        }
      }
      cVar7 = expr[lVar11 + 1];
      lVar11 = lVar11 + 1;
    } while( true );
  }
  lVar11 = 0;
  if (cVar7 == '\0') {
    return 0;
  }
  iVar12 = -1;
LAB_00154102:
  qstring = expr + (search == 0);
  local_60 = candidate;
  while( true ) {
    cVar7 = *qstring;
    if (cVar7 == '\0') goto LAB_0015432d;
    while (pcVar14 = qstring + 1, cVar7 == '*') {
      qstring = pcVar14;
      cVar7 = *pcVar14;
    }
    if (cVar7 == '\0') goto LAB_0015432d;
    lVar6 = 0;
    while ((cVar7 != '\0' && (cVar7 != '*'))) {
      pcVar8 = pcVar14 + lVar6;
      lVar6 = lVar6 + 1;
      cVar7 = *pcVar8;
    }
    iVar4 = (int)lVar6;
    if ((search == 0) && (cVar7 == '\0')) break;
    lVar13 = 0;
    pcVar8 = local_60;
    while( true ) {
      pcVar8 = pcVar8 + 1;
      cVar9 = *qstring;
      if ((long)cVar9 != 0x3f) break;
      if (iVar4 - 1U == (uint)lVar13) {
        iVar3 = 0;
        goto LAB_00154246;
      }
      qstring = qstring + 1;
      lVar1 = lVar13 + 1;
      lVar13 = lVar13 + 1;
      if (local_60[lVar1] == '\0') {
        return -1;
      }
    }
    if (insensitive != 0) {
      pp_Var5 = __ctype_tolower_loc();
      cVar9 = (char)(*pp_Var5)[cVar9];
    }
    iVar3 = 0;
    while( true ) {
      uVar10 = (ulong)pcVar8[-1];
      if (uVar10 == 0) {
        return -1;
      }
      if (insensitive != 0) {
        pp_Var5 = __ctype_tolower_loc();
        uVar10 = (ulong)(uint)(*pp_Var5)[uVar10];
      }
      if (((int)uVar10 == (int)cVar9) &&
         (iVar2 = stb__match_qstring(pcVar8,pcVar14 + lVar13,~(uint)lVar13 + iVar4,insensitive),
         iVar2 != 0)) break;
      pcVar8 = pcVar8 + 1;
      iVar3 = iVar3 + 1;
    }
LAB_00154246:
    if (iVar12 < 0) {
      iVar12 = iVar3 + (int)lVar11;
    }
    if (cVar7 != '*') {
      if (cVar7 != '\0') {
        __assert_fail("*expr == \'*\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x2325,"int stb__wildmatch_raw2(char *, char *, int, int)");
      }
      if (search == 0) {
        __assert_fail("search",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x2321,"int stb__wildmatch_raw2(char *, char *, int, int)");
      }
      return iVar12;
    }
    local_60 = local_60 + (uint)(iVar3 + iVar4);
    qstring = pcVar14 + lVar6;
  }
  lVar11 = 0;
  while (lVar6 != lVar11) {
    pcVar14 = local_60 + lVar11;
    lVar11 = lVar11 + 1;
    if (*pcVar14 == '\0') {
      return -1;
    }
  }
  local_60 = local_60 + -1;
  do {
    pcVar14 = local_60 + lVar6 + 1;
    local_60 = local_60 + 1;
  } while (*pcVar14 != '\0');
  iVar4 = stb__match_qstring(local_60,qstring,iVar4,insensitive);
  if (iVar4 == 0) {
    return -1;
  }
LAB_0015432d:
  if (iVar12 < 1) {
    return 0;
  }
  return iVar12;
}

Assistant:

int stb__wildmatch_raw2(char *expr, char *candidate, int search, int insensitive)
{
   int where=0;
   int start = -1;
   
   if (!search) {
      // parse to first '*'
      if (*expr != '*')
         start = 0;
      while (*expr != '*') {
         if (!*expr)
            return *candidate == 0 ? 0 : -1;
         if (*expr == '?') {
            if (!*candidate) return -1;
         } else {
            if (insensitive) {
               if (tolower(*candidate) != tolower(*expr))
                  return -1;
            } else 
               if (*candidate != *expr)
                  return -1;
         }
         ++candidate, ++expr, ++where;
      }
   } else {
      // 0-length search string
      if (!*expr)
         return 0;
   }

   assert(search || *expr == '*');
   if (!search)
      ++expr;

   // implicit '*' at this point
      
   while (*expr) {
      int o=0;
      // combine redundant * characters
      while (expr[0] == '*') ++expr;

      // ok, at this point, expr[-1] == '*',
      // and expr[0] != '*'

      if (!expr[0]) return start >= 0 ? start : 0;

      // now find next '*'
      o = 0;
      while (expr[o] != '*') {
         if (expr[o] == 0)
            break;
         ++o;
      }
      // if no '*', scan to end, then match at end
      if (expr[o] == 0 && !search) {
         int z;
         for (z=0; z < o; ++z)
            if (candidate[z] == 0)
               return -1;
         while (candidate[z])
            ++z;
         // ok, now check if they match
         if (stb__match_qstring(candidate+z-o, expr, o, insensitive))
            return start >= 0 ? start : 0;
         return -1; 
      } else {
         // if yes '*', then do stb__find_qmatch on the intervening chars
         int n = stb__find_qstring(candidate, expr, o, insensitive);
         if (n < 0)
            return -1;
         if (start < 0)
            start = where + n;
         expr += o;
         candidate += n+o;
      }

      if (*expr == 0) {
         assert(search);
         return start;
      }

      assert(*expr == '*');
      ++expr;
   }

   return start >= 0 ? start : 0;
}